

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

Value * duckdb::Value::TIME(Value *__return_storage_ptr__,dtime_t value)

{
  LogicalType local_30;
  
  LogicalType::LogicalType(&local_30,TIME);
  Value(__return_storage_ptr__,&local_30);
  LogicalType::~LogicalType(&local_30);
  (__return_storage_ptr__->value_).time.micros = value.micros;
  __return_storage_ptr__->is_null = false;
  return __return_storage_ptr__;
}

Assistant:

Value Value::TIME(dtime_t value) {
	Value result(LogicalType::TIME);
	result.value_.time = value;
	result.is_null = false;
	return result;
}